

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::addChildLayout(QLayout *this,QLayout *childLayout)

{
  long lVar1;
  QObject *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QWidget *pQVar5;
  QLayout *in_RSI;
  undefined8 in_RDI;
  int line;
  long in_FS_OFFSET;
  QWidget *mw;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa8;
  QString local_40;
  char local_28 [16];
  QWidget *in_stack_ffffffffffffffe8;
  QLayoutPrivate *in_stack_fffffffffffffff0;
  
  line = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QObject::parent((QObject *)0x33e4d4);
  if (pQVar2 == (QObject *)0x0) {
    QObject::setParent(&in_RSI->super_QObject);
    pQVar5 = parentWidget(in_RSI);
    if (pQVar5 != (QWidget *)0x0) {
      d_func((QLayout *)0x33e585);
      QLayoutPrivate::reparentChildWidgets(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RSI,in_stack_ffffffffffffffa8,line,in_stack_ffffffffffffff98);
    (*(code *)**(undefined8 **)in_RSI)();
    uVar3 = QMetaObject::className();
    QObject::objectName();
    QtPrivate::asString(&local_40);
    uVar4 = QString::utf16();
    QMessageLogger::warning
              (local_28,"QLayout::addChildLayout: layout %s \"%ls\" already has a parent",uVar3,
               uVar4);
    QString::~QString((QString *)0x33e553);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLayout::addChildLayout(QLayout *childLayout)
{
    if (Q_UNLIKELY(childLayout->parent())) {
        qWarning("QLayout::addChildLayout: layout %s \"%ls\" already has a parent",
                 childLayout->metaObject()->className(), qUtf16Printable(childLayout->objectName()));
        return;
    }
    childLayout->setParent(this);

    if (QWidget *mw = parentWidget()) {
        childLayout->d_func()->reparentChildWidgets(mw);
    }

}